

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall ipx::Model::LoadDual(Model *this)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  double *pdVar5;
  double *pdVar6;
  reference pvVar7;
  undefined1 *in_RDI;
  Int j_3;
  Int j_2;
  Int i_1;
  double x_2;
  double *__end1_2;
  double *__begin1_2;
  Vector *__range1_2;
  double x_1;
  double *__end1_1;
  double *__begin1_1;
  Vector *__range1_1;
  double x;
  double *__end1;
  double *__begin1;
  Vector *__range1;
  Int put;
  Int i;
  Int j_1;
  Int j;
  SparseMatrix *in_stack_fffffffffffffe98;
  SparseMatrix *in_stack_fffffffffffffea0;
  valarray<double> *in_stack_fffffffffffffea8;
  SparseMatrix *in_stack_fffffffffffffeb0;
  double dVar8;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  double local_138;
  int local_10c;
  int local_108;
  int local_104;
  SparseMatrix *in_stack_ffffffffffffff00;
  double *local_f0;
  double *local_d0;
  double *local_b0;
  int local_9c;
  int local_98;
  int local_94;
  int local_c;
  
  *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(in_RDI + 0x170);
  iVar2 = *(int *)(in_RDI + 0x168);
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x180));
  *(int *)(in_RDI + 8) = iVar2 + (int)sVar4;
  *in_RDI = 1;
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x170); local_c = local_c + 1) {
    pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x1f8),(long)local_c);
    std::isfinite(*pdVar5);
  }
  Transpose((SparseMatrix *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  SparseMatrix::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  SparseMatrix::~SparseMatrix(in_stack_fffffffffffffea0);
  for (local_94 = 0; local_94 < *(int *)(in_RDI + 0x170); local_94 = local_94 + 1) {
    pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x1f8),(long)local_94);
    bVar3 = std::isfinite(*pdVar5);
    if (bVar3) {
      SparseMatrix::push_back
                (in_stack_fffffffffffffeb0,(Int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 (double)in_stack_fffffffffffffea0);
      SparseMatrix::add_column(in_stack_ffffffffffffff00);
    }
  }
  for (local_98 = 0; local_98 < *(int *)(in_RDI + 4); local_98 = local_98 + 1) {
    SparseMatrix::push_back
              (in_stack_fffffffffffffeb0,(Int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               (double)in_stack_fffffffffffffea0);
    SparseMatrix::add_column(in_stack_ffffffffffffff00);
  }
  std::valarray<double>::operator=
            ((valarray<double> *)in_stack_fffffffffffffea0,
             (valarray<double> *)in_stack_fffffffffffffe98);
  std::valarray<double>::resize
            ((valarray<double> *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8,
             (double)in_stack_fffffffffffffea0);
  local_9c = 0;
  local_b0 = std::begin<double>((valarray<double> *)in_stack_fffffffffffffea0);
  pdVar5 = std::end<double>(in_stack_fffffffffffffea8);
  for (; local_b0 != pdVar5; local_b0 = local_b0 + 1) {
    dVar8 = *local_b0;
    pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x128),(long)local_9c);
    *pdVar6 = -dVar8;
    local_9c = local_9c + 1;
  }
  local_d0 = std::begin<double>((valarray<double> *)in_stack_fffffffffffffea0);
  pdVar5 = std::end<double>(in_stack_fffffffffffffea8);
  for (; local_d0 != pdVar5; local_d0 = local_d0 + 1) {
    dVar8 = *local_d0;
    bVar3 = std::isfinite(dVar8);
    if (bVar3) {
      pdVar6 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x128),(long)local_9c);
      *pdVar6 = dVar8;
      local_9c = local_9c + 1;
    }
  }
  local_f0 = std::begin<double>((valarray<double> *)in_stack_fffffffffffffea0);
  pdVar5 = std::end<double>(in_stack_fffffffffffffea8);
  for (; local_f0 != pdVar5; local_f0 = local_f0 + 1) {
    local_138 = *local_f0;
    bVar3 = std::isfinite(local_138);
    if (bVar3) {
      local_138 = -local_138;
    }
    else {
      local_138 = 0.0;
    }
    pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x128),(long)local_9c);
    *pdVar6 = local_138;
    local_9c = local_9c + 1;
  }
  std::valarray<double>::resize
            ((valarray<double> *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8,
             (double)in_stack_fffffffffffffea0);
  std::valarray<double>::resize
            ((valarray<double> *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8,
             (double)in_stack_fffffffffffffea0);
  for (local_104 = 0; local_104 < *(int *)(in_RDI + 0x168); local_104 = local_104 + 1) {
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x198),(long)local_104);
    cVar1 = *pvVar7;
    if (cVar1 == '<') {
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x138),(long)local_104);
      *pdVar5 = -INFINITY;
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x148),(long)local_104);
      *pdVar5 = 0.0;
    }
    else if (cVar1 == '=') {
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x138),(long)local_104);
      *pdVar5 = -INFINITY;
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x148),(long)local_104);
      *pdVar5 = INFINITY;
    }
    else if (cVar1 == '>') {
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x138),(long)local_104);
      *pdVar5 = 0.0;
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x148),(long)local_104);
      *pdVar5 = INFINITY;
    }
  }
  for (local_108 = *(int *)(in_RDI + 0x168); local_108 < *(int *)(in_RDI + 8);
      local_108 = local_108 + 1) {
    pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x138),(long)local_108)
    ;
    *pdVar5 = 0.0;
    pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x148),(long)local_108)
    ;
    *pdVar5 = INFINITY;
  }
  for (local_10c = 0; local_10c < *(int *)(in_RDI + 0x170); local_10c = local_10c + 1) {
    pdVar5 = std::valarray<double>::operator[]
                       ((valarray<double> *)(in_RDI + 0x138),
                        (long)(*(int *)(in_RDI + 8) + local_10c));
    *pdVar5 = 0.0;
    pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x1e8),(long)local_10c)
    ;
    bVar3 = std::isfinite(*pdVar5);
    dVar8 = INFINITY;
    if (!bVar3) {
      dVar8 = 0.0;
    }
    pdVar5 = std::valarray<double>::operator[]
                       ((valarray<double> *)(in_RDI + 0x148),
                        (long)(*(int *)(in_RDI + 8) + local_10c));
    *pdVar5 = dVar8;
  }
  return;
}

Assistant:

void Model::LoadDual() {
    num_rows_ = num_var_;
    num_cols_ = num_constr_ + boxed_vars_.size();
    dualized_ = true;

    // Check that every variable with finite scaled_ubuser_ has finite
    // scaled_lbuser_ (must be the case after scaling).
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j]))
            assert(std::isfinite(scaled_lbuser_[j]));
    }

    // Build AI.
    AI_ = Transpose(A_);
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j])) {
            AI_.push_back(j, -1.0);
            AI_.add_column();
        }
    }
    assert(AI_.cols() == num_cols_);
    for (Int i = 0; i < num_rows_; i++) {
        AI_.push_back(i, 1.0);
        AI_.add_column();
    }

    // Build vectors.
    b_ = scaled_obj_;
    c_.resize(num_cols_+num_rows_);
    Int put = 0;
    for (double x : scaled_rhs_)
        c_[put++] = -x;
    for (double x : scaled_ubuser_)
        if (std::isfinite(x))
            c_[put++] = x;
    assert(put == num_cols_);
    for (double x : scaled_lbuser_)
        // If x is negative infinity, then the variable will be fixed and we can
        // give it any (finite) cost.
        c_[put++] = std::isfinite(x) ? -x : 0.0;
    lb_.resize(num_cols_+num_rows_);
    ub_.resize(num_cols_+num_rows_);
    for (Int i = 0; i < num_constr_; i++)
        switch(constr_type_[i]) {
        case '=':
            lb_[i] = -INFINITY;
            ub_[i] = INFINITY;
            break;
        case '<':
            lb_[i] = -INFINITY;
            ub_[i] = 0.0;
            break;
        case '>':
            lb_[i] = 0.0;
            ub_[i] = INFINITY;
            break;
        }
    for (Int j = num_constr_; j < num_cols_; j++) {
        lb_[j] = 0.0;
        ub_[j] = INFINITY;
    }
    for (Int j = 0; j < num_var_; j++) {
        lb_[num_cols_+j] = 0.0;
        ub_[num_cols_+j] = std::isfinite(scaled_lbuser_[j]) ? INFINITY : 0.0;
    }
}